

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<long_long>::data(QList<long_long> *this)

{
  QArrayDataPointer<long_long> *this_00;
  longlong *plVar1;
  QArrayDataPointer<long_long> *in_RDI;
  
  detach((QList<long_long> *)0x73267c);
  this_00 = (QArrayDataPointer<long_long> *)QArrayDataPointer<long_long>::operator->(in_RDI);
  plVar1 = QArrayDataPointer<long_long>::data(this_00);
  return plVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }